

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squared_loss.h
# Opt level: O0

string * __thiscall xLearn::SquaredLoss::loss_type_abi_cxx11_(SquaredLoss *this)

{
  string *in_RDI;
  allocator local_11 [17];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"mse_loss",local_11);
  std::allocator<char>::~allocator((allocator<char> *)local_11);
  return in_RDI;
}

Assistant:

std::string loss_type() { return "mse_loss"; }